

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_endian.c
# Opt level: O3

void test_convert_htobe32(void)

{
  uint32_t check;
  uint32_t check_pattern;
  uint32_t local_10 [2];
  
  local_10[1] = 0x78563412;
  local_10[0] = cio_htobe32(0x12345678);
  UnityAssertEqualMemory
            (local_10 + 1,local_10,4,1,"32 bit endian conversion incorrect!",0x58,
             UNITY_ARRAY_TO_ARRAY);
  return;
}

Assistant:

static void test_convert_htobe32(void)
{
	uint8_t pattern_array[] = {0x78, 0x56, 0x34, 0x12};
	uint32_t pattern;
	memcpy(&pattern, pattern_array, sizeof(pattern));
	uint32_t check_pattern = 0x78563412;

	uint32_t check = cio_htobe32(pattern);

	TEST_ASSERT_EQUAL_MEMORY_MESSAGE(&check_pattern, &check, sizeof(check), "32 bit endian conversion incorrect!");
}